

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O0

_Bool valid_rep(cs_struct *h,uint opcode)

{
  unsigned_short uVar1;
  uint uVar2;
  int i;
  uint id;
  uint opcode_local;
  cs_struct *h_local;
  
  uVar1 = insn_find(insns,0x1726,opcode,&h->insn_cache);
  if (uVar1 == 0) {
    return false;
  }
  uVar2 = (uint)insns[(int)(uint)uVar1].mapid;
  if (((uVar2 != 0xd9) && (1 < uVar2 - 0xdc)) && (uVar2 != 0x148)) {
    if (uVar2 == 0x149) {
      if (opcode == 0x517) {
        return true;
      }
      return false;
    }
    if ((1 < uVar2 - 0x14a) && (uVar2 != 0x1cf)) {
      if (uVar2 == 0x1d0) {
        if (opcode == 0x6ae) {
          return true;
        }
        return false;
      }
      if (((uVar2 != 0x1d3) && (uVar2 != 0x1d5)) && ((2 < uVar2 - 0x1ea && (uVar2 != 0x29b)))) {
        if (uVar2 == 0x29c) {
          if (opcode == 0xab1) {
            return true;
          }
          return false;
        }
        if (1 < uVar2 - 0x29d) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

static bool valid_rep(cs_struct *h, unsigned int opcode)
{
	unsigned int id;
	int i = insn_find(insns, ARR_SIZE(insns), opcode, &h->insn_cache);
	if (i != 0) {
		id = insns[i].mapid;
		switch(id) {
			default:
				return false;

			case X86_INS_MOVSB:
			case X86_INS_MOVSW:
			case X86_INS_MOVSQ:

			case X86_INS_LODSB:
			case X86_INS_LODSW:
			case X86_INS_LODSQ:

			case X86_INS_STOSB:
			case X86_INS_STOSW:
			case X86_INS_STOSQ:

			case X86_INS_INSB:
			case X86_INS_INSW:
			case X86_INS_INSD:

			case X86_INS_OUTSB:
			case X86_INS_OUTSW:
			case X86_INS_OUTSD:
				return true;

			// following are some confused instructions, which have the same
			// mnemonics in 128bit media instructions. Intel is horribly crazy!
			case X86_INS_MOVSD:
				if (opcode == X86_MOVSL) // REP MOVSD
					return true;
				return false;

			case X86_INS_LODSD:
				if (opcode == X86_LODSL) // REP LODSD
					return true;
				return false;

			case X86_INS_STOSD:
				if (opcode == X86_STOSL) // REP STOSD
					return true;
				return false;
		}
	}

	// not found
	return false;
}